

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<double>_>::Decompose_LDLt(TPZMatrix<std::complex<double>_> *this)

{
  byte bVar1;
  bool bVar2;
  TPZMatrix<std::complex<double>_> *pTVar3;
  int k_1;
  ulong uVar4;
  ulong uVar5;
  int k;
  ulong uVar6;
  long lVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double in_XMM1_Qa;
  double dVar8;
  complex<double> a;
  undefined1 local_a8 [16];
  double local_98;
  double dStack_90;
  complex<double> tmp;
  double local_78;
  double dStack_70;
  long local_68;
  undefined1 local_60 [16];
  ulong local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  uVar4 = (this->super_TPZBaseMatrix).fRow;
  if (uVar4 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    uVar4 = (this->super_TPZBaseMatrix).fRow;
  }
  uVar5 = 0;
  local_50 = 0;
  if (0 < (int)uVar4) {
    local_50 = uVar4 & 0xffffffff;
  }
  local_68 = 1;
  local_48 = uVar4;
  for (; uVar5 != local_50; uVar5 = uVar5 + 1) {
    local_98 = 0.0;
    dStack_90 = 0.0;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar6);
      local_a8._8_8_ = in_XMM1_Qa;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar5);
      dVar8 = -in_XMM1_Qa;
      local_78 = extraout_XMM0_Qa;
      dStack_70 = dVar8;
      std::operator*((complex<double> *)local_a8,(complex<double> *)&local_78);
      tmp._M_value._8_8_ = dVar8;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar6,uVar5);
      local_60._8_8_ = dVar8;
      std::operator*(&tmp,(complex<double> *)local_60);
      in_XMM1_Qa = local_98 + extraout_XMM0_Qa_00;
      dStack_90 = dStack_90 + dVar8;
      local_98 = in_XMM1_Qa;
    }
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar5,uVar5);
    tmp._M_value._0_8_ = extraout_XMM0_Qa_01 - local_98;
    tmp._M_value._8_8_ = in_XMM1_Qa - dStack_90;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,uVar5,uVar5,&tmp);
    uVar6 = uVar5;
    pTVar3 = this;
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar5,uVar5);
    a._M_value._8_8_ = uVar6;
    a._M_value._0_8_ = pTVar3;
    tmp._M_value._8_8_ = in_XMM1_Qa;
    bVar2 = IsZero(a);
    lVar7 = local_68;
    if (bVar2) {
      Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      lVar7 = local_68;
    }
    for (; (int)lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
      local_98 = 0.0;
      dStack_90 = 0.0;
      for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar4,uVar4);
        local_78 = extraout_XMM0_Qa_02;
        dStack_70 = in_XMM1_Qa;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar5,uVar4);
        dVar8 = -in_XMM1_Qa;
        local_60._8_8_ = dVar8;
        std::operator*((complex<double> *)&local_78,(complex<double> *)local_60);
        local_a8._8_8_ = dVar8;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,uVar4);
        local_40._8_8_ = dVar8;
        std::operator*((complex<double> *)local_a8,(complex<double> *)local_40);
        in_XMM1_Qa = local_98 + extraout_XMM0_Qa_03;
        dStack_90 = dStack_90 + dVar8;
        local_98 = in_XMM1_Qa;
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,lVar7,uVar5);
      local_78 = extraout_XMM0_Qa_04 - local_98;
      dStack_70 = in_XMM1_Qa - dStack_90;
      std::operator/((complex<double> *)&local_78,&tmp);
      local_a8._8_8_ = in_XMM1_Qa;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,lVar7,uVar5,local_a8);
      local_a8._8_8_ = -(double)local_a8._8_8_;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,uVar5,lVar7,local_a8);
      uVar4 = local_48;
    }
    local_68 = local_68 + 1;
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}